

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O1

void toml::detail::skip_value<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  result<toml::value_t,_toml::error_info> local_80;
  
  guess_value_type<toml::type_config>(&local_80,loc,ctx);
  if (local_80.is_ok_ == false) {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_80.field_1.succ_);
    local_80.field_1._0_4_ = 0;
  }
  if ((char)local_80.field_1._0_4_ == '\x04') {
    skip_string_like<toml::type_config>(loc,ctx);
  }
  else if ((local_80.field_1._0_4_ & 0xff) == 9) {
    skip_array_like<toml::type_config>(loc,ctx);
  }
  else if ((local_80.field_1._0_4_ & 0xff) == 10) {
    skip_inline_table_like<toml::type_config>(loc,ctx);
  }
  else {
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar7 = loc->location_;
    lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar2;
    if (uVar7 < uVar4) {
      sVar5 = loc->line_number_;
      sVar6 = loc->column_number_;
      do {
        if (*(char *)(lVar2 + uVar7) == '\n') {
          return;
        }
        if (uVar7 < uVar4) {
          if (*(char *)(lVar2 + uVar7) == ',') {
            return;
          }
          if (uVar7 < uVar4) {
            if (*(char *)(lVar2 + uVar7) == ']') {
              return;
            }
            if ((uVar7 < uVar4) && (*(char *)(lVar2 + uVar7) == '}')) {
              return;
            }
          }
        }
        if (uVar7 + 1 < uVar4) {
          if (*(char *)(lVar2 + uVar7) == '\n') {
            sVar5 = sVar5 + 1;
            loc->line_number_ = sVar5;
            sVar6 = 1;
          }
          else {
            sVar6 = sVar6 + 1;
          }
          loc->column_number_ = sVar6;
          uVar3 = uVar7 + 1;
        }
        else {
          for (; uVar3 = uVar4, uVar4 != uVar7; uVar7 = uVar7 + 1) {
            if (*(char *)(lVar2 + uVar7) == '\n') {
              sVar5 = sVar5 + 1;
              loc->line_number_ = sVar5;
              sVar6 = 1;
            }
            else {
              sVar6 = sVar6 + 1;
            }
            loc->column_number_ = sVar6;
          }
        }
        uVar7 = uVar3;
        loc->location_ = uVar7;
      } while (uVar7 < uVar4);
    }
  }
  return;
}

Assistant:

void skip_value(location& loc, const context<TC>& ctx)
{
    value_t ty = guess_value_type(loc, ctx).unwrap_or(value_t::empty);
    if(ty == value_t::string)
    {
        skip_string_like(loc, ctx);
    }
    else if(ty == value_t::array)
    {
        skip_array_like(loc, ctx);
    }
    else if(ty == value_t::table)
    {
        // In case of multiline tables, it may skip key-value pair but not the
        // whole table.
        skip_inline_table_like(loc, ctx);
    }
    else // others are an "in-line" values. skip until the next line
    {
        while( ! loc.eof())
        {
            if(loc.current() == '\n')
            {
                break;
            }
            else if(loc.current() == ',' || loc.current() == ']' || loc.current() == '}')
            {
                break;
            }
            loc.advance();
        }
    }
    return;
}